

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O0

void __thiscall
adios2::utils::Reorganize::
print0<char_const(&)[22],int&,char_const(&)[3],std::__cxx11::string_const&>
          (Reorganize *this,char (*arg) [22],int *args,char (*args_1) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char *in_RCX;
  int *in_RDX;
  char *in_RSI;
  long in_RDI;
  string *in_R8;
  
  if (*(int *)(in_RDI + 0x150) == 0) {
    std::operator<<((ostream *)&std::cout,in_RSI);
    std::ostream::operator<<((ostream *)&std::cout,*in_RDX);
    std::operator<<((ostream *)&std::cout,in_RCX);
    std::operator<<((ostream *)&std::cout,in_R8);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Reorganize::print0(Arg &&arg, Args &&...args)
{
    if (!m_Rank)
    {
        std::cout << std::forward<Arg>(arg);
        using expander = int[];
        (void)expander{0, (void(std::cout << std::forward<Args>(args)), 0)...};
        std::cout << std::endl;
    }
}